

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_agree_comp(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *comp,
                  unsigned_long comp_len)

{
  LIBSSH2_COMP_METHOD **methodlist;
  char *pcVar1;
  uchar *puVar2;
  uchar *puVar3;
  LIBSSH2_COMP_METHOD *pLVar4;
  size_t sVar5;
  int iVar6;
  
  methodlist = _libssh2_comp_methods(session);
  puVar3 = (uchar *)endpoint->comp_prefs;
  if (puVar3 == (uchar *)0x0) {
    do {
      pLVar4 = *methodlist;
      if (pLVar4 == (LIBSSH2_COMP_METHOD *)0x0) {
        return -1;
      }
      puVar3 = (uchar *)pLVar4->name;
      if (puVar3 == (uchar *)0x0) {
        return -1;
      }
      sVar5 = strlen((char *)puVar3);
      puVar3 = kex_agree_instr(comp,comp_len,puVar3,sVar5);
      methodlist = methodlist + 1;
    } while (puVar3 == (uchar *)0x0);
LAB_0011e5af:
    endpoint->comp = pLVar4;
    iVar6 = 0;
  }
  else {
    while ((puVar3 != (uchar *)0x0 && (*puVar3 != '\0'))) {
      pcVar1 = strchr((char *)puVar3,0x2c);
      if (pcVar1 == (char *)0x0) {
        sVar5 = strlen((char *)puVar3);
      }
      else {
        sVar5 = (long)pcVar1 - (long)puVar3;
      }
      puVar2 = kex_agree_instr(comp,comp_len,puVar3,sVar5);
      if (puVar2 != (uchar *)0x0) {
        pLVar4 = (LIBSSH2_COMP_METHOD *)
                 kex_get_method_by_name((char *)puVar3,sVar5,(LIBSSH2_COMMON_METHOD **)methodlist);
        if (pLVar4 == (LIBSSH2_COMP_METHOD *)0x0) {
          return -1;
        }
        goto LAB_0011e5af;
      }
      puVar3 = (uchar *)(pcVar1 + 1);
      if (pcVar1 == (char *)0x0) {
        puVar3 = (uchar *)0x0;
      }
    }
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int kex_agree_comp(LIBSSH2_SESSION *session,
                          libssh2_endpoint_data *endpoint, unsigned char *comp,
                          unsigned long comp_len)
{
    const LIBSSH2_COMP_METHOD **compp = _libssh2_comp_methods(session);
    unsigned char *s;
    (void) session;

    if (endpoint->comp_prefs) {
        s = (unsigned char *) endpoint->comp_prefs;

        while (s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if (kex_agree_instr(comp, comp_len, s, method_len)) {
                const LIBSSH2_COMP_METHOD *method =
                    (const LIBSSH2_COMP_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           compp);

                if (!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->comp = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while (*compp && (*compp)->name) {
        s = kex_agree_instr(comp, comp_len, (unsigned char *) (*compp)->name,
                            strlen((*compp)->name));
        if (s) {
            endpoint->comp = *compp;
            return 0;
        }
        compp++;
    }

    return -1;
}